

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine.cpp
# Opt level: O3

QString * QFileSystemEngine::resolveGroupName
                    (QString *__return_storage_ptr__,QFileSystemEntry *entry,
                    QFileSystemMetaData *metaData)

{
  if (((metaData->knownFlagsMask).super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
       super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i & 0x20000000) == 0) {
    fillMetaData(entry,metaData,(MetaDataFlags)0x20000000);
  }
  if (((metaData->entryFlags).super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
       super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i & 0x400000) == 0) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    resolveGroupName(__return_storage_ptr__,metaData->groupId_);
  }
  return __return_storage_ptr__;
}

Assistant:

QString QFileSystemEngine::resolveGroupName(const QFileSystemEntry &entry, QFileSystemMetaData &metaData)
{
#if defined(Q_OS_WIN)
    Q_UNUSED(metaData);
    return QFileSystemEngine::owner(entry, QAbstractFileEngine::OwnerGroup);
#else //(Q_OS_UNIX)
    if (!metaData.hasFlags(QFileSystemMetaData::GroupId))
        QFileSystemEngine::fillMetaData(entry, metaData, QFileSystemMetaData::GroupId);
    if (!metaData.exists())
        return QString();
    return resolveGroupName(metaData.groupId());
#endif
}